

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# interactions.cc
# Opt level: O0

void INTERACTIONS::expand_namespaces_with_recursion
               (string *ns,
               vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
               *res,string *val,size_t pos)

{
  bool bVar1;
  string *psVar2;
  char *pcVar3;
  string *in_RCX;
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  *in_RDX;
  string *in_RSI;
  ulong in_RDI;
  uchar j;
  undefined7 in_stack_ffffffffffffffd8;
  undefined1 in_stack_ffffffffffffffdf;
  byte c;
  string *val_00;
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  *res_00;
  
  val_00 = in_RCX;
  psVar2 = (string *)std::__cxx11::string::size();
  if (in_RCX == psVar2) {
    std::
    vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
    ::push_back((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                 *)val_00,
                (value_type *)CONCAT17(in_stack_ffffffffffffffdf,in_stack_ffffffffffffffd8));
  }
  else {
    pcVar3 = (char *)std::__cxx11::string::operator[](in_RDI);
    if (*pcVar3 == ':') {
      for (c = 0x20; c < 0x7f; c = c + 1) {
        bVar1 = valid_ns(c);
        if (bVar1) {
          std::__cxx11::string::push_back((char)in_RDX);
          expand_namespaces_with_recursion
                    (in_RSI,in_RDX,val_00,CONCAT17(c,in_stack_ffffffffffffffd8));
          std::__cxx11::string::pop_back();
        }
      }
    }
    else {
      res_00 = in_RDX;
      std::__cxx11::string::operator[](in_RDI);
      std::__cxx11::string::push_back((char)in_RDX);
      expand_namespaces_with_recursion
                (in_RSI,res_00,val_00,CONCAT17(in_stack_ffffffffffffffdf,in_stack_ffffffffffffffd8))
      ;
      std::__cxx11::string::pop_back();
    }
  }
  return;
}

Assistant:

void expand_namespaces_with_recursion(
    std::string const& ns, std::vector<std::string>& res, std::string& val, size_t pos)
{
  assert(pos <= ns.size());

  if (pos == ns.size())
  {
    // we're at the end of interaction

    // and store it in res
    res.push_back(val);
    // don't free s memory as it's data will be used later
  }
  else
  {
    // we're at the middle of interaction
    if (ns[pos] != ':')
    {
      // not a wildcard
      val.push_back(ns[pos]);
      expand_namespaces_with_recursion(ns, res, val, pos + 1);
      val.pop_back();  // i don't need value itself
    }
    else
    {
      for (unsigned char j = printable_start; j <= printable_end; ++j)
      {
        if (valid_ns(j))
        {
          val.push_back(j);
          expand_namespaces_with_recursion(ns, res, val, pos + 1);
          val.pop_back();  // i don't need value itself
        }
      }
    }
  }
}